

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace::IfcBoxedHalfSpace(IfcBoxedHalfSpace *this)

{
  IfcBoxedHalfSpace *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcBoxedHalfSpace");
  IfcHalfSpaceSolid::IfcHalfSpaceSolid
            (&this->super_IfcHalfSpaceSolid,&PTR_construction_vtable_24__00fc4038);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace,_1UL> *)
             &(this->super_IfcHalfSpaceSolid).field_0x58,&PTR_construction_vtable_24__00fc40b0);
  (this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfc3f80;
  *(undefined8 *)&this->field_0x70 = 0xfc4020;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfc3fa8;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfc3fd0;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x58 = 0xfc3ff8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcBoundingBox>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcBoundingBox> *)
             &(this->super_IfcHalfSpaceSolid).field_0x68,(LazyObject *)0x0);
  return;
}

Assistant:

IfcBoxedHalfSpace() : Object("IfcBoxedHalfSpace") {}